

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::postStep(Integrator *this)

{
  RealType RVar1;
  SnapshotManager *pSVar2;
  long *in_RDI;
  RealType difference;
  ProgressBar *in_stack_00000050;
  StatWriter *in_stack_00000130;
  DumpWriter *in_stack_000001c0;
  RealType in_stack_00000258;
  Velocitizer *in_stack_00000260;
  RNEMD *in_stack_000002e0;
  RNEMD *in_stack_00000790;
  Stats *in_stack_00000920;
  RNEMD *in_stack_00000c70;
  RealType in_stack_ffffffffffffffd8;
  Snapshot *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)((long)in_RDI + 0xb3) & 1) != 0) {
    RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    if ((0.0 < RVar1 - (double)in_RDI[0xb]) ||
       (ABS(RVar1 - (double)in_RDI[0xb]) <= (double)in_RDI[0x1e])) {
      std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
                ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                 0x201ae5);
      Velocitizer::randomize(in_stack_00000260,in_stack_00000258);
      in_RDI[0xb] = (long)((double)in_RDI[6] + (double)in_RDI[0xb]);
    }
  }
  if ((*(byte *)((long)in_RDI + 0xb4) & 1) != 0) {
    RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    if ((0.0 < RVar1 - (double)in_RDI[0xd]) ||
       (ABS(RVar1 - (double)in_RDI[0xd]) <= (double)in_RDI[0x1e])) {
      std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator->
                ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
                 0x201b87);
      RNEMD::RNEMD::doRNEMD(in_stack_00000790);
      in_RDI[0xd] = (long)((double)in_RDI[8] + (double)in_RDI[0xd]);
    }
    std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator->
              ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
               0x201bb4);
    RNEMD::RNEMD::collectData(in_stack_00000c70);
    std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator->
              ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
               0x201bcd);
    RNEMD::RNEMD::writeOutputFile(in_stack_000002e0);
  }
  saveConservedQuantity((Integrator *)in_stack_ffffffffffffffe0);
  RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  if ((0.0 < RVar1 - (double)in_RDI[9]) || (ABS(RVar1 - (double)in_RDI[9]) <= (double)in_RDI[0x1e]))
  {
    DumpWriter::writeDumpAndEor(in_stack_000001c0);
    in_RDI[9] = (long)((double)in_RDI[4] + (double)in_RDI[9]);
  }
  RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  if ((0.0 < RVar1 - (double)in_RDI[10]) ||
     (ABS(RVar1 - (double)in_RDI[10]) <= (double)in_RDI[0x1e])) {
    Stats::collectStats(in_stack_00000920);
    StatWriter::writeStat(in_stack_00000130);
    in_stack_ffffffffffffffe0 =
         (Snapshot *)
         std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator->
                   ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
                    0x201ce3);
    RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    ProgressBar::setStatus((ProgressBar *)in_stack_ffffffffffffffe0,RVar1,(RealType)in_RDI[3]);
    std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator->
              ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
               0x201d21);
    ProgressBar::update(in_stack_00000050);
    *(undefined1 *)(in_RDI + 0x16) = 0;
    *(undefined1 *)((long)in_RDI + 0xb1) = 0;
    in_RDI[10] = (long)((double)in_RDI[5] + (double)in_RDI[10]);
  }
  RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  if (((*(byte *)((long)in_RDI + 0xb2) & 1) != 0) &&
     ((0.0 < RVar1 - (double)in_RDI[0xc] ||
      (ABS(RVar1 - (double)in_RDI[0xc]) <= (double)in_RDI[0x1e])))) {
    (**(code **)(*in_RDI + 0x40))();
    in_RDI[0xc] = (long)((double)in_RDI[7] + (double)in_RDI[0xc]);
  }
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0xe]);
  (*pSVar2->_vptr_SnapshotManager[2])();
  Snapshot::increaseTime(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Integrator::postStep() {
    RealType difference;

    if (needVelocityScaling) {
      difference = snap->getTime() - currThermal;

      if (difference > 0 || std::fabs(difference) <= dtEps) {
        velocitizer_->randomize(targetScalingTemp);
        currThermal += thermalTime;
      }
    }

    if (useRNEMD) {
      difference = snap->getTime() - currRNEMD;

      if (difference > 0 || std::fabs(difference) <= dtEps) {
        rnemd_->doRNEMD();
        currRNEMD += RNEMD_exchangeTime;
      }

      rnemd_->collectData();
      rnemd_->writeOutputFile();
    }

    saveConservedQuantity();

    difference = snap->getTime() - currSample;

    if (difference > 0 || std::fabs(difference) <= dtEps) {
      dumpWriter->writeDumpAndEor();
      currSample += sampleTime;
    }

    difference = snap->getTime() - currStatus;

    if (difference > 0 || std::fabs(difference) <= dtEps) {
      stats->collectStats();

      statWriter->writeStat();

      progressBar->setStatus(snap->getTime(), runTime);
      progressBar->update();

      needPotential = false;
      needVirial    = false;
      currStatus += statusTime;
    }

    difference = snap->getTime() - currReset;

    if (needReset && (difference > 0 || std::fabs(difference) <= dtEps)) {
      resetIntegrator();
      currReset += resetTime;
    }
    // save snapshot
    info_->getSnapshotManager()->advance();

    // increase time
    snap->increaseTime(dt);
  }